

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLeft3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *eps,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec,int *idx,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *rhs,int *ridx,int rn,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs2,int *ridx2,int rn2,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec3,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs3,int *ridx3,int rn3)

{
  int iVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RCX;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDX;
  cpp_dec_float<200U,_int,_void> *in_RSI;
  long in_RDI;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R9;
  int in_stack_00000008;
  int in_stack_000000f0;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffad0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffad8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffae0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffae8;
  uint in_stack_fffffffffffffe04;
  int *in_stack_fffffffffffffe08;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe18;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe20;
  uint in_stack_ffffffffffffff04;
  uint in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff68;
  uint uVar2;
  int *in_stack_ffffffffffffff70;
  cpp_dec_float<200U,_int,_void> *nonz;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff80;
  cpp_dec_float<200U,_int,_void> *eps_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff88;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  uVar2 = SUB84(in_stack_ffffffffffffff68,4);
  if (*(int *)(in_RDI + 0x2f8) == 0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    in_stack_00000008 =
         solveUpdateLeft(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,uVar2);
    uVar2 = (uint)((ulong)&stack0xfffffffffffffe20 >> 0x20);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    solveUleft(in_RDX,in_RCX,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_R8,(int *)in_R9,in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10,
               in_stack_000000f0);
    vec_00 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&stack0xfffffffffffffda0;
    nonz = in_RSI;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
    solveUpdateLeft(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,vec_00,(int *)nonz,uVar2);
    this_00 = (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&stack0xfffffffffffffd20;
    eps_00 = in_RSI;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
    solveUleftNoNZ(in_R8,in_R9,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
    solveUpdateLeft(this_00,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)eps_00,vec_00,(int *)nonz,uVar2);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
    solveUleftNoNZ(in_R8,in_R9,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    solveUleft(in_RDX,in_RCX,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_R8,(int *)in_R9,in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10,
               in_stack_000000f0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
    solveLleftForest(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                     in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
    solveUleftNoNZ(in_R8,in_R9,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04);
    solveLleftForestNoNZ(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
    solveUleftNoNZ(in_R8,in_R9,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04);
    solveLleftForestNoNZ(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_RSI,(cpp_dec_float<200U,_int,_void> *)
                    CONCAT44(in_stack_fffffffffffff98c,in_stack_00000008));
  iVar1 = solveLleft(in_R8,in_R9,in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  solveLleftNoNZ(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  solveLleftNoNZ(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft3(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2,          /* rhs2    */
                              R* vec3,                               /* result3 */
                              R* rhs3, int* ridx3, int rn3)          /* rhs3    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      rn3 = solveUpdateLeft(eps, rhs3, ridx3, rn3);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
      solveLleftForestNoNZ(vec3);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);
   solveLleftNoNZ(vec3);

   return rn;
}